

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

double util::rpn_eval(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *stack,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *vars)

{
  _func_double_vector<double,_std::allocator<double>_> *p_Var1;
  vector<double,_std::allocator<double>_> vVar2;
  int iVar3;
  _Elt_pointer pdVar4;
  const_iterator cVar5;
  runtime_error *this;
  _Elt_pointer pbVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  vector<double,_std::allocator<double>_> args;
  stack<double,_std::deque<double,_std::allocator<double>_>_> argstack;
  undefined8 in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  pointer in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> local_c0;
  _Deque_base<double,_std::allocator<double>_> local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_50;
  vector<double,_std::allocator<double>_> local_48;
  string *__k;
  
  local_50 = &vars->_M_h;
  if (rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
      ::rpn_eval_funcs == '\0') {
    rpn_eval();
  }
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (double *)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(&local_a8,0);
  if ((stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_001941d7:
    if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      uVar9 = 0;
      uVar10 = 0;
    }
    else {
      pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar9 = SUB84(pdVar4[-1],0);
      uVar10 = (undefined4)((ulong)pdVar4[-1] >> 0x20);
    }
    in_stack_ffffffffffffff30 = (double)CONCAT44(uVar10,uVar9);
  }
  else {
LAB_00193f7d:
    do {
      pbVar6 = (stack->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar6 == (stack->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar6 = (stack->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      __k = pbVar6 + -1;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&stack->c);
      lVar8 = 0;
      do {
        iVar3 = std::__cxx11::string::compare((char *)__k);
        if (iVar3 == 0) {
LAB_00193fdd:
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_c0,rpn_eval::rpn_eval_funcs[lVar8].args,
                     (allocator_type *)&stack0xffffffffffffff38);
          if (rpn_eval::rpn_eval_funcs[lVar8].args != 0) {
            uVar7 = 0;
            do {
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"RPN Stack underflow");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = pdVar4[-1];
              if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < rpn_eval::rpn_eval_funcs[lVar8].args);
          }
          p_Var1 = rpn_eval::rpn_eval_funcs[lVar8].func;
          std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_c0);
          vVar2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)in_stack_ffffffffffffff30;
          vVar2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)in_stack_ffffffffffffff28;
          vVar2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = in_stack_ffffffffffffff38;
          in_stack_ffffffffffffff38 = (pointer)(*p_Var1)(vVar2);
          std::deque<double,_std::allocator<double>_>::emplace_back<double>
                    ((deque<double,_std::allocator<double>_> *)&local_a8,
                     (double *)&stack0xffffffffffffff38);
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar3 = 4;
          if ((stack->c).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (stack->c).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pdVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            in_stack_ffffffffffffff30 = pdVar4[-1];
            iVar3 = 1;
          }
          if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          iVar3 = 0;
          if ((rpn_eval::rpn_eval_funcs[lVar8].op != ' ') &&
             (*(__k->_M_dataplus)._M_p == rpn_eval::rpn_eval_funcs[lVar8].op)) goto LAB_00193fdd;
        }
        if (iVar3 != 0) goto LAB_00194144;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x22);
      iVar3 = 5;
LAB_00194144:
      if (iVar3 == 5) {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_50,__k);
        if (cVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)tdparse(__k);
          std::deque<double,_std::allocator<double>_>::emplace_back<double>
                    ((deque<double,_std::allocator<double>_> *)&local_a8,(double *)&local_c0);
        }
        else {
          if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            iVar3 = 0;
            std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                      ((deque<double,std::allocator<double>> *)&local_a8,
                       (double *)
                       ((long)cVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              ._M_cur + 0x28));
            goto LAB_001941b8;
          }
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               *(double *)
                ((long)cVar5.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                       ._M_cur + 0x28);
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        iVar3 = 0;
      }
LAB_001941b8:
      if (iVar3 == 0) {
        if ((stack->c).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (stack->c).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_001941d7;
        goto LAB_00193f7d;
      }
    } while (iVar3 == 4);
  }
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_a8);
  return in_stack_ffffffffffffff30;
}

Assistant:

double rpn_eval(std::stack<std::string> stack, const std::unordered_map<std::string, double>& vars)
{
	struct rpn_eval_func
	{
		char op;
		const char *name;
		std::size_t args;
		double (*func)(std::vector<double>);

		rpn_eval_func(char op_, const char *name_, std::size_t args_, double (*func_)(std::vector<double>)) : op(op_), name(name_), args(args_), func(func_) { }
	};

	static const rpn_eval_func rpn_eval_funcs[] = {
		rpn_eval_func('+', "add",   2, rpn_eval_add),
		rpn_eval_func('-', "sub",   2, rpn_eval_sub),
		rpn_eval_func('*', "mul",   2, rpn_eval_mul),
		rpn_eval_func('/', "div",   2, rpn_eval_div),
		rpn_eval_func('%', "mod",   2, rpn_eval_mod),
		rpn_eval_func('&', "bitand",2, rpn_eval_bitand),
		rpn_eval_func('|', "bitor", 2, rpn_eval_bitor),
		rpn_eval_func('^', "bitxor",2, rpn_eval_bitxor),
		rpn_eval_func('~', "bitnot",1, rpn_eval_bitnot),
		rpn_eval_func(op_and,"and", 2, rpn_eval_and),
		rpn_eval_func(op_or,"or",   2, rpn_eval_or),
		rpn_eval_func('!', "not",   1, rpn_eval_not),
		rpn_eval_func(op_neg,"neg", 1, rpn_eval_neg),
		rpn_eval_func(' ', "pow",   2, rpn_eval_pow),
		rpn_eval_func(' ', "sqrt",  1, rpn_eval_sqrt),
		rpn_eval_func(' ', "log",   1, rpn_eval_log),
		rpn_eval_func(' ', "exp",   1, rpn_eval_exp),
		rpn_eval_func(' ', "ln",    1, rpn_eval_ln),
		rpn_eval_func(' ', "sin",   1, rpn_eval_sin),
		rpn_eval_func(' ', "cos",   1, rpn_eval_cos),
		rpn_eval_func(' ', "tan",   1, rpn_eval_tan),
		rpn_eval_func(' ', "rand",  2, rpn_eval_rand),
		rpn_eval_func(' ', "min",   2, rpn_eval_min),
		rpn_eval_func(' ', "max",   2, rpn_eval_max),
		rpn_eval_func(' ', "ceil",  1, rpn_eval_ceil),
		rpn_eval_func(' ', "round", 1, rpn_eval_round),
		rpn_eval_func(' ', "floor", 1, rpn_eval_floor),
		rpn_eval_func('<', "lt",    2, rpn_eval_lt),
		rpn_eval_func(op_lte,"lte", 2, rpn_eval_lte),
		rpn_eval_func('=', "eq",    2, rpn_eval_eq),
		rpn_eval_func(op_ne,"ne",   2, rpn_eval_ne),
		rpn_eval_func(op_gte,"gte", 2, rpn_eval_gte),
		rpn_eval_func('>', "gt",    2, rpn_eval_gt),

		rpn_eval_func('?', "iif",   3, rpn_eval_iif),
	};

	std::stack<double> argstack;

	while (!stack.empty())
	{
		start_of_loop:

		const std::string& val = stack.top();
		stack.pop();

		for (std::size_t i = 0; i < sizeof(rpn_eval_funcs) / sizeof(rpn_eval_func); ++i)
		{
			const rpn_eval_func &func = rpn_eval_funcs[i];

			if (val == func.name || (func.op != ' ' && val[0] == func.op))
			{
				std::vector<double> args(func.args);

				for (std::size_t ii = 0; ii < func.args; ++ii)
				{
					if (argstack.empty())
					{
						throw std::runtime_error("RPN Stack underflow");
					}

					args[ii] = argstack.top();
					argstack.pop();
				}

				argstack.push(func.func(args));

				if (stack.empty())
					return argstack.top();

				goto start_of_loop;
			}
		}

		auto findvar = vars.find(val);

		if (findvar != vars.end())
		{
			argstack.push(findvar->second);
		}
		else
		{
			argstack.push(util::tdparse(val));
		}
	}

	if (argstack.empty())
		return 0.0;

	return argstack.top();
}